

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

void __thiscall
kj::anon_unknown_30::OwnedFileDescriptor::OwnedFileDescriptor
          (OwnedFileDescriptor *this,int fd,uint flags)

{
  int iVar1;
  Fault f;
  int opt;
  Fault local_48;
  undefined4 local_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  
  this->fd = fd;
  this->flags = flags;
  if ((flags & 4) == 0) {
    local_3c = 1;
    do {
      iVar1 = ioctl(fd,0x5421,&local_3c);
      if (-1 < iVar1) {
        iVar1 = 0;
        break;
      }
      iVar1 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar1 == -1);
    if (iVar1 != 0) {
      local_48.exception = (Exception *)0x0;
      local_38 = 0;
      uStack_30 = 0;
      kj::_::Debug::Fault::init
                (&local_48,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                );
      kj::_::Debug::Fault::fatal(&local_48);
    }
  }
  if ((flags & 3) == 1) {
    do {
      iVar1 = ioctl(fd,0x5451);
      if (-1 < iVar1) {
        iVar1 = 0;
        break;
      }
      iVar1 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar1 == -1);
    if (iVar1 != 0) {
      local_48.exception = (Exception *)0x0;
      local_38 = 0;
      uStack_30 = 0;
      kj::_::Debug::Fault::init
                (&local_48,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                );
      kj::_::Debug::Fault::fatal(&local_48);
    }
  }
  return;
}

Assistant:

OwnedFileDescriptor(int fd, uint flags): fd(fd), flags(flags) {
    if (flags & LowLevelAsyncIoProvider::ALREADY_NONBLOCK) {
      KJ_DREQUIRE(fcntl(fd, F_GETFL) & O_NONBLOCK, "You claimed you set NONBLOCK, but you didn't.");
    } else {
      setNonblocking(fd);
    }

    if (flags & LowLevelAsyncIoProvider::TAKE_OWNERSHIP) {
      if (flags & LowLevelAsyncIoProvider::ALREADY_CLOEXEC) {
        KJ_DREQUIRE(fcntl(fd, F_GETFD) & FD_CLOEXEC,
                    "You claimed you set CLOEXEC, but you didn't.");
      } else {
        setCloseOnExec(fd);
      }
    }
  }